

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerBase.h
# Opt level: O2

void __thiscall RayTracerBase::RayTracerBase(RayTracerBase *this,RayTracerConfig *config)

{
  long lVar1;
  
  RayTracerConfig::RayTracerConfig(&this->config,config);
  lVar1 = (long)(config->super_BaseConfig).antiAliasing;
  DynamicArray2D<RGB>::DynamicArray2D
            (&this->bitmap,(config->super_BaseConfig).imageY * lVar1,
             (config->super_BaseConfig).imageZ * lVar1);
  return;
}

Assistant:

RayTracerBase(RayTracerConfig const& config)
    : config(config)
    , bitmap(config.imageY * config.antiAliasing, config.imageZ * config.antiAliasing)
  {
  }